

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

filemgr * get_instance_UNLOCKED(char *filename)

{
  hash_elem *phVar1;
  hash *in_RDI;
  filemgr *file;
  hash_elem *e;
  filemgr query;
  filemgr *local_310;
  filemgr *local_8;
  
  if (in_RDI == (hash *)0x0) {
    local_8 = (filemgr *)0x0;
  }
  else {
    local_310 = (filemgr *)0x0;
    phVar1 = hash_find(in_RDI,(hash_elem *)0x0);
    if (phVar1 != (hash_elem *)0x0) {
      local_310 = (filemgr *)(phVar1 + -10);
    }
    local_8 = local_310;
  }
  return local_8;
}

Assistant:

static filemgr* get_instance_UNLOCKED(const char *filename)
{
    if (!filename) {
        return NULL;
    }

    struct filemgr query;
    struct hash_elem *e = NULL;
    struct filemgr *file = NULL;

    query.filename = (char*)filename;
    e = hash_find(&hash, &query.e);
    if (e) {
        file = _get_entry(e, struct filemgr, e);
    }
    return file;
}